

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
inf_or_nan_writer::operator()(inf_or_nan_writer *this,counting_iterator<char> *it)

{
  char *__last;
  undefined8 in_R8;
  counting_iterator<char> cVar1;
  
  __last = (char *)it->count_;
  if (*this != (inf_or_nan_writer)0x0) {
    __last = __last + 1;
    it->count_ = (size_t)__last;
  }
  cVar1.count_ = (ulong)*(uint *)&it->blackhole_;
  cVar1._8_8_ = in_R8;
  cVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,fmt::v5::internal::counting_iterator<char>>
                    (*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8),
                     (char *)(*(__copy_move<false,false,std::random_access_iterator_tag> **)
                               (this + 8) + 3),__last,cVar1);
  it->count_ = cVar1.count_;
  it->blackhole_ = cVar1.blackhole_;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }